

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureStd.cpp
# Opt level: O0

void testFutureStd(int iterations)

{
  long lVar1;
  code *local_38;
  undefined1 local_30 [8];
  future<long> future;
  long lStack_18;
  int i;
  int64_t result;
  int iterations_local;
  
  lStack_18 = 0;
  for (future.super___basic_future<long>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._4_4_ = 0;
      future.super___basic_future<long>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ < iterations;
      future.super___basic_future<long>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = future.super___basic_future<long>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._4_4_ + 1) {
    local_38 = testFutureStd::A::testProc;
    std::async<long(*)(long),int&>((_func_long_long **)local_30,(int *)&local_38);
    lVar1 = std::future<long>::get((future<long> *)local_30);
    lStack_18 = lVar1 + lStack_18;
    std::future<long>::~future((future<long> *)local_30);
  }
  if (lStack_18 != ((long)iterations * (long)(iterations + -1)) / 2) {
    printf("fail\n");
    std::terminate();
  }
  return;
}

Assistant:

void testFutureStd(int iterations)
{
  struct A
  {
    static int64_t testProc(int64_t i)
    {
      return i;
    }
  };

  int64_t result = 0;
  for(int i = 0; i < iterations; ++i)
  {
    std::future<int64_t> future = std::async(&A::testProc, i);
    result += future.get();
  }
  if(result != (int64_t)iterations * (int64_t)(iterations - 1) / 2)
  {
    printf("fail\n");
    std::terminate();
  }
}